

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlDocPtr htmlSAXParseDoc(xmlChar *cur,char *encoding,htmlSAXHandlerPtr sax,void *userData)

{
  htmlParserCtxtPtr ctxt_00;
  htmlParserCtxtPtr ctxt;
  htmlDocPtr ret;
  void *userData_local;
  htmlSAXHandlerPtr sax_local;
  char *encoding_local;
  xmlChar *cur_local;
  
  xmlInitParser();
  if (cur == (xmlChar *)0x0) {
    cur_local = (xmlChar *)0x0;
  }
  else {
    ctxt_00 = htmlCreateDocParserCtxt(cur,encoding);
    if (ctxt_00 == (htmlParserCtxtPtr)0x0) {
      cur_local = (xmlChar *)0x0;
    }
    else {
      if (sax != (htmlSAXHandlerPtr)0x0) {
        if (ctxt_00->sax != (_xmlSAXHandler *)0x0) {
          (*xmlFree)(ctxt_00->sax);
        }
        ctxt_00->sax = sax;
        ctxt_00->userData = userData;
      }
      htmlParseDocument(ctxt_00);
      cur_local = (xmlChar *)ctxt_00->myDoc;
      if (sax != (htmlSAXHandlerPtr)0x0) {
        ctxt_00->sax = (_xmlSAXHandler *)0x0;
        ctxt_00->userData = (void *)0x0;
      }
      htmlFreeParserCtxt(ctxt_00);
    }
  }
  return (htmlDocPtr)cur_local;
}

Assistant:

htmlDocPtr
htmlSAXParseDoc(const xmlChar *cur, const char *encoding,
                htmlSAXHandlerPtr sax, void *userData) {
    htmlDocPtr ret;
    htmlParserCtxtPtr ctxt;

    xmlInitParser();

    if (cur == NULL) return(NULL);


    ctxt = htmlCreateDocParserCtxt(cur, encoding);
    if (ctxt == NULL) return(NULL);
    if (sax != NULL) {
        if (ctxt->sax != NULL) xmlFree (ctxt->sax);
        ctxt->sax = sax;
        ctxt->userData = userData;
    }

    htmlParseDocument(ctxt);
    ret = ctxt->myDoc;
    if (sax != NULL) {
	ctxt->sax = NULL;
	ctxt->userData = NULL;
    }
    htmlFreeParserCtxt(ctxt);

    return(ret);
}